

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

char * leveldb::GetVarint32PtrFallback(char *p,char *limit,uint32_t *value)

{
  byte bVar1;
  uint32_t shift;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0;
  uVar2 = 0;
  while( true ) {
    if (0x1c < uVar2) {
      return (char *)0x0;
    }
    if (limit <= p) break;
    bVar1 = *p;
    if (-1 < (char)bVar1) {
      *value = (uint)bVar1 << ((byte)uVar2 & 0x1f) | uVar3;
      return (char *)((byte *)p + 1);
    }
    p = (char *)((byte *)p + 1);
    uVar3 = uVar3 | (bVar1 & 0x7f) << ((byte)uVar2 & 0x1f);
    uVar2 = uVar2 + 7;
  }
  return (char *)0x0;
}

Assistant:

const char* GetVarint32PtrFallback(const char* p, const char* limit,
                                   uint32_t* value) {
  uint32_t result = 0;
  for (uint32_t shift = 0; shift <= 28 && p < limit; shift += 7) {
    uint32_t byte = *(reinterpret_cast<const unsigned char*>(p));
    p++;
    if (byte & 128) {
      // More bytes are present
      result |= ((byte & 127) << shift);
    } else {
      result |= (byte << shift);
      *value = result;
      return reinterpret_cast<const char*>(p);
    }
  }
  return nullptr;
}